

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O3

bool __thiscall CompilationContext::isWarningSuppressed(CompilationContext *this,char *text_id)

{
  int iVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var2;
  long lVar3;
  int id;
  undefined1 local_24 [4];
  
  lVar3 = 8;
  do {
    iVar1 = strcmp(text_id,*(char **)((long)&analyzer_messages[0].intId + lVar3));
    if (iVar1 == 0) break;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x860);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    ((this->suppressWarnings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->suppressWarnings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,local_24);
  return _Var2._M_current !=
         (this->suppressWarnings).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
}

Assistant:

bool CompilationContext::isWarningSuppressed(const char * text_id)
{
  int id = -1;
  for (int i = 0; i < sizeof(analyzer_messages) / sizeof(analyzer_messages[0]); i++)
    if (!strcmp(text_id, analyzer_messages[i].textId))
    {
      id = analyzer_messages[i].intId;
      break;
    }

  return (std::find(suppressWarnings.begin(), suppressWarnings.end(), id) != suppressWarnings.end());
}